

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_xbm.c
# Opt level: O0

void gdImageXbmCtx(gdImagePtr image,char *file_name,int fg,gdIOCtx *out)

{
  int iVar1;
  _func_int_gdIOCtx_ptr_void_ptr_int *p_Var2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  ushort **ppuVar7;
  size_t l;
  size_t i;
  char *f;
  char *name;
  int p;
  int sy;
  int sx;
  int b;
  int c;
  int y;
  int x;
  gdIOCtx *out_local;
  int fg_local;
  char *file_name_local;
  gdImagePtr image_local;
  
  pcVar5 = strrchr(file_name,0x2f);
  f = file_name;
  if (pcVar5 != (char *)0x0) {
    f = pcVar5 + 1;
  }
  pcVar5 = strrchr(f,0x5c);
  if (pcVar5 != (char *)0x0) {
    f = pcVar5 + 1;
  }
  f = strdup(f);
  pcVar5 = strrchr(f,0x2e);
  if ((pcVar5 != (char *)0x0) && (iVar3 = strcasecmp(pcVar5,".XBM"), iVar3 == 0)) {
    *pcVar5 = '\0';
  }
  sVar6 = strlen(f);
  if (sVar6 == 0) {
    free(f);
    f = strdup("image");
  }
  else {
    for (l = 0; l < sVar6; l = l + 1) {
      ppuVar7 = __ctype_b_loc();
      if (((((*ppuVar7)[(int)f[l]] & 0x100) == 0) &&
          (ppuVar7 = __ctype_b_loc(), ((*ppuVar7)[(int)f[l]] & 0x200) == 0)) &&
         (ppuVar7 = __ctype_b_loc(), ((*ppuVar7)[(int)f[l]] & 0x800) == 0)) {
        f[l] = '_';
      }
    }
  }
  (*out->putBuf)(out,"#define ",8);
  p_Var2 = out->putBuf;
  sVar6 = strlen(f);
  (*p_Var2)(out,f,(int)sVar6);
  (*out->putBuf)(out,"_width ",7);
  gdCtxPrintf(out,"%d\n",(ulong)(uint)image->sx);
  (*out->putBuf)(out,"#define ",8);
  p_Var2 = out->putBuf;
  sVar6 = strlen(f);
  (*p_Var2)(out,f,(int)sVar6);
  (*out->putBuf)(out,"_height ",8);
  gdCtxPrintf(out,"%d\n",(ulong)(uint)image->sy);
  (*out->putBuf)(out,"static unsigned char ",0x15);
  p_Var2 = out->putBuf;
  sVar6 = strlen(f);
  (*p_Var2)(out,f,(int)sVar6);
  (*out->putBuf)(out,"_bits[] = {\n  ",0xe);
  free(f);
  sy = 1;
  name._4_4_ = 0;
  sx = 0;
  iVar3 = image->sx;
  iVar1 = image->sy;
  for (b = 0; b < iVar1; b = b + 1) {
    for (c = 0; c < iVar3; c = c + 1) {
      iVar4 = gdImageGetPixel(image,c,b);
      if (iVar4 == fg) {
        sx = sy | sx;
      }
      if ((sy == 0x80) || (c == iVar3 + -1)) {
        sy = 1;
        if ((name._4_4_ != 0) && ((*out->putBuf)(out,", ",2), name._4_4_ % 0xc == 0)) {
          (*out->putBuf)(out,"\n  ",3);
          name._4_4_ = 0xc;
        }
        name._4_4_ = name._4_4_ + 1;
        gdCtxPrintf(out,"0x%02X",(ulong)(uint)sx);
        sx = 0;
      }
      else {
        sy = sy << 1;
      }
    }
  }
  (*out->putBuf)(out,"};\n",3);
  return;
}

Assistant:

BGD_DECLARE(void) gdImageXbmCtx(gdImagePtr image, char* file_name, int fg, gdIOCtx * out)
{
	int x, y, c, b, sx, sy, p;
	char *name, *f;
	size_t i, l;

	name = file_name;
	if ((f = strrchr(name, '/')) != NULL) name = f+1;
	if ((f = strrchr(name, '\\')) != NULL) name = f+1;
	name = strdup(name);
	if ((f = strrchr(name, '.')) != NULL && !strcasecmp(f, ".XBM")) *f = '\0';
	if ((l = strlen(name)) == 0) {
		free(name);
		name = strdup("image");
	} else {
		for (i=0; i<l; i++) {
			/* only in C-locale isalnum() would work */
			if (!isupper(name[i]) && !islower(name[i]) && !isdigit(name[i])) {
				name[i] = '_';
			}
		}
	}

	/* Since "name" comes from the user, run it through a direct puts.
	 * Trying to printf it into a local buffer means we'd need a large
	 * or dynamic buffer to hold it all. */

	/* #define <name>_width 1234 */
	gdCtxPuts(out, "#define ");
	gdCtxPuts(out, name);
	gdCtxPuts(out, "_width ");
	gdCtxPrintf(out, "%d\n", gdImageSX(image));

	/* #define <name>_height 1234 */
	gdCtxPuts(out, "#define ");
	gdCtxPuts(out, name);
	gdCtxPuts(out, "_height ");
	gdCtxPrintf(out, "%d\n", gdImageSY(image));

	/* static unsigned char <name>_bits[] = {\n */
	gdCtxPuts(out, "static unsigned char ");
	gdCtxPuts(out, name);
	gdCtxPuts(out, "_bits[] = {\n  ");

	free(name);

	b = 1;
	p = 0;
	c = 0;
	sx = gdImageSX(image);
	sy = gdImageSY(image);
	for (y = 0; y < sy; y++) {
		for (x = 0; x < sx; x++) {
			if (gdImageGetPixel(image, x, y) == fg) {
				c |= b;
			}
			if ((b == 128) || (x == sx - 1)) {
				b = 1;
				if (p) {
					gdCtxPuts(out, ", ");
					if (!(p%12)) {
						gdCtxPuts(out, "\n  ");
						p = 12;
					}
				}
				p++;
				gdCtxPrintf(out, "0x%02X", c);
				c = 0;
			} else {
				b <<= 1;
			}
		}
	}
	gdCtxPuts(out, "};\n");
}